

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orderedCollection.c
# Opt level: O1

sysbvm_tuple_t
sysbvm_orderedCollection_asWordArray(sysbvm_context_t *context,sysbvm_tuple_t orderedCollection)

{
  ulong uVar1;
  sysbvm_tuple_t sVar2;
  sysbvm_tuple_t slotCount;
  sysbvm_tuple_t sVar3;
  undefined4 uVar4;
  ulong uVar5;
  
  if ((orderedCollection & 0xf) == 0 && orderedCollection != 0) {
    if (*(long *)(orderedCollection + 0x18) == 0) {
      sVar2 = sysbvm_wordArray_create(context,0);
      return sVar2;
    }
    uVar1 = *(ulong *)(orderedCollection + 0x10);
    if (uVar1 == 0 || (uVar1 & 0xf) != 0) {
      slotCount = (long)uVar1 >> 4;
    }
    else {
      slotCount = *(sysbvm_tuple_t *)(uVar1 + 0x10);
    }
    sVar2 = sysbvm_wordArray_create(context,slotCount);
    if (slotCount != 0) {
      uVar1 = *(ulong *)(orderedCollection + 0x18);
      sVar3 = 0;
      do {
        if ((uVar1 & 0xf) == 0 && uVar1 != 0) {
          uVar5 = *(ulong *)(uVar1 + 0x10 + sVar3 * 8);
        }
        else {
          uVar5 = 0;
        }
        if (uVar5 == 0 || (uVar5 & 0xf) != 0) {
          uVar4 = (undefined4)(uVar5 >> 4);
        }
        else {
          uVar4 = *(undefined4 *)(uVar5 + 0x10);
        }
        *(undefined4 *)(sVar2 + 0x10 + sVar3 * 4) = uVar4;
        sVar3 = sVar3 + 1;
      } while (slotCount != sVar3);
    }
  }
  else {
    sVar2 = 0;
  }
  return sVar2;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_orderedCollection_asWordArray(sysbvm_context_t *context, sysbvm_tuple_t orderedCollection)
{
    if(!sysbvm_tuple_isNonNullPointer(orderedCollection))
        return SYSBVM_NULL_TUPLE;

    sysbvm_orderedCollection_t *orderedCollectionObject = (sysbvm_orderedCollection_t*)orderedCollection;
    if(!orderedCollectionObject->storage)
        return sysbvm_wordArray_create(context, 0);

    size_t size = sysbvm_tuple_size_decode(orderedCollectionObject->size);
    sysbvm_tuple_t wordArray = sysbvm_wordArray_create(context, size);
    uint32_t *words = (uint32_t*)SYSBVM_CAST_OOP_TO_OBJECT_TUPLE(wordArray)->bytes;
    for(size_t i = 0; i < size; ++i)
        words[i] = sysbvm_tuple_uint32_decode(sysbvm_array_at(orderedCollectionObject->storage, i));

    return wordArray;
}